

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O1

void nite::print(char *c)

{
  string local_38;
  allocator local_11;
  
  std::__cxx11::string::string((string *)&local_38,c,&local_11);
  print(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void nite::print(const char *c){
		nite::print(String(c));
}